

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O2

int amqp_device_delayed_stop(AMQP_DEVICE_HANDLE handle,size_t delay_secs)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (handle == (AMQP_DEVICE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x38b;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x38b;
    }
    pcVar4 = "Failed stopping device (handle is NULL)";
    iVar3 = 0x38a;
  }
  else if (handle->state < DEVICE_STATE_STARTING) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x394;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x394;
    }
    pcVar4 = "Failed stopping device \'%s\' (device is already stopped or stopping)";
    iVar3 = 0x393;
  }
  else {
    iVar1 = tickcounter_get_current_ms(handle->tick_counter_handle,&handle->last_stop_request_time);
    if (iVar1 == 0) {
      update_state(handle,DEVICE_STATE_STOPPING);
      handle->stop_delay_ms = delay_secs * 1000;
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x399;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x399;
    }
    pcVar4 = "Failed stopping device \'%s\' (could not get tickcounter time)";
    iVar3 = 0x398;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
            ,"amqp_device_delayed_stop",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int amqp_device_delayed_stop(AMQP_DEVICE_HANDLE handle, size_t delay_secs)
{
    int result;

    if (handle == NULL)
    {
        LogError("Failed stopping device (handle is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_DEVICE_INSTANCE* instance = (AMQP_DEVICE_INSTANCE*)handle;

        if (instance->state == DEVICE_STATE_STOPPED || instance->state == DEVICE_STATE_STOPPING)
        {
            LogError("Failed stopping device '%s' (device is already stopped or stopping)", instance->config->device_id);
            result = MU_FAILURE;
        }
        else if (tickcounter_get_current_ms(instance->tick_counter_handle, &instance->last_stop_request_time) != 0)
        {
            LogError("Failed stopping device '%s' (could not get tickcounter time)", instance->config->device_id);
            result = MU_FAILURE;
        }
        else
        {
            update_state(instance, DEVICE_STATE_STOPPING);
            instance->stop_delay_ms = delay_secs * 1000;
            result = RESULT_OK;
        }
    }

    return result;
}